

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O1

bool __thiscall flatbuffers::ts::TsGenerator::generate(TsGenerator *this)

{
  bool bVar1;
  
  generateEnums(this);
  generateStructs(this);
  if ((((this->super_BaseGenerator).parser_)->opts).ts_omit_entrypoint == false) {
    generateEntry(this);
  }
  bVar1 = generateBundle(this);
  return bVar1;
}

Assistant:

bool generate() {
    generateEnums();
    generateStructs();
    if (!parser_.opts.ts_omit_entrypoint) { generateEntry(); }
    if (!generateBundle()) return false;
    return true;
  }